

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clparser.cc
# Opt level: O0

bool CLParser::FilterInputFilename(string *line)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool local_fa;
  allocator<char> local_e1;
  string local_e0;
  byte local_bb;
  byte local_ba;
  allocator<char> local_b9;
  string local_b8;
  byte local_93;
  byte local_92;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_59;
  string local_58;
  char *local_38;
  char *local_30;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  string *local_18;
  string *line_local;
  
  local_18 = line;
  local_20._M_current = (char *)std::__cxx11::string::begin();
  local_28._M_current = (char *)std::__cxx11::string::end();
  local_30 = (char *)std::__cxx11::string::begin();
  local_38 = (char *)std::
                     transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char(*)(char)>
                               (local_20,local_28,
                                (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 )local_30,ToLowerASCII);
  std::allocator<char>::allocator();
  local_92 = 0;
  local_93 = 0;
  local_ba = 0;
  local_bb = 0;
  bVar2 = false;
  bVar1 = false;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,".c",&local_59);
  bVar3 = anon_unknown.dwarf_3d6cb::EndsWith(line,&local_58);
  local_fa = true;
  if (!bVar3) {
    std::allocator<char>::allocator();
    local_92 = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,".cc",&local_91);
    local_93 = 1;
    bVar3 = anon_unknown.dwarf_3d6cb::EndsWith(line,&local_90);
    local_fa = true;
    if (!bVar3) {
      std::allocator<char>::allocator();
      local_ba = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,".cxx",&local_b9);
      local_bb = 1;
      bVar3 = anon_unknown.dwarf_3d6cb::EndsWith(line,&local_b8);
      local_fa = true;
      if (!bVar3) {
        std::allocator<char>::allocator();
        bVar2 = true;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,".cpp",&local_e1);
        bVar1 = true;
        local_fa = anon_unknown.dwarf_3d6cb::EndsWith(line,&local_e0);
      }
    }
  }
  line_local._7_1_ = local_fa;
  if (bVar1) {
    std::__cxx11::string::~string((string *)&local_e0);
  }
  if (bVar2) {
    std::allocator<char>::~allocator(&local_e1);
  }
  if ((local_bb & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_b8);
  }
  if ((local_ba & 1) != 0) {
    std::allocator<char>::~allocator(&local_b9);
  }
  if ((local_93 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_90);
  }
  if ((local_92 & 1) != 0) {
    std::allocator<char>::~allocator(&local_91);
  }
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  return (bool)(line_local._7_1_ & 1);
}

Assistant:

bool CLParser::FilterInputFilename(string line) {
  transform(line.begin(), line.end(), line.begin(), ToLowerASCII);
  // TODO: other extensions, like .asm?
  return EndsWith(line, ".c") ||
      EndsWith(line, ".cc") ||
      EndsWith(line, ".cxx") ||
      EndsWith(line, ".cpp");
}